

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O1

pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
* __thiscall
hanabi_learning_env::HanabiState::ChanceOutcomes
          (pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,HanabiState *this)

{
  pointer *ppHVar1;
  HanabiMove move_00;
  iterator __position;
  iterator __position_00;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  HanabiMove move;
  HanabiMove local_40;
  double local_38;
  
  (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = HanabiGame::MaxChanceOutcomes(this->parent_game_);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      move_00 = (this->parent_game_->chance_outcomes_).
                super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar4];
      local_40 = move_00;
      bVar2 = MoveIsLegal(this,move_00);
      if (bVar2) {
        __position._M_current =
             (__return_storage_ptr__->first).
             super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->first).
            super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<hanabi_learning_env::HanabiMove,std::allocator<hanabi_learning_env::HanabiMove>>::
          _M_realloc_insert<hanabi_learning_env::HanabiMove_const&>
                    ((vector<hanabi_learning_env::HanabiMove,std::allocator<hanabi_learning_env::HanabiMove>>
                      *)__return_storage_ptr__,__position,&local_40);
        }
        else {
          *__position._M_current = move_00;
          ppHVar1 = &(__return_storage_ptr__->first).
                     super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppHVar1 = *ppHVar1 + 1;
        }
        local_38 = (double)(this->deck_).card_count_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(local_40._3_4_ >> 0x18) * (this->deck_).num_ranks_ +
                            (int)local_40.rank_] / (double)(this->deck_).total_count_;
        __position_00._M_current =
             (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&__return_storage_ptr__->second,__position_00,&local_38);
        }
        else {
          *__position_00._M_current = local_38;
          (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<HanabiMove>, std::vector<double>>
HanabiState::ChanceOutcomes() const {
  std::pair<std::vector<HanabiMove>, std::vector<double>> rv;
  int max_outcome_uid = ParentGame()->MaxChanceOutcomes();
  for (int uid = 0; uid < max_outcome_uid; ++uid) {
    HanabiMove move = ParentGame()->GetChanceOutcome(uid);
    if (MoveIsLegal(move)) {
      rv.first.push_back(move);
      rv.second.push_back(ChanceOutcomeProb(move));
    }
  }
  return rv;
}